

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O2

Pipeline * __thiscall
n_e_s::core::Mos6502::create_branch_instruction
          (Pipeline *__return_storage_ptr__,Mos6502 *this,function<bool_()> *condition)

{
  undefined8 *puVar1;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  undefined1 local_68 [8];
  undefined1 auStack_60 [16];
  code *local_50;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  Pipeline::Pipeline(__return_storage_ptr__);
  local_68 = (undefined1  [8])this;
  std::function<bool_()>::function((function<bool_()> *)auStack_60,condition);
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  puVar1 = (undefined8 *)operator_new(0x28);
  *puVar1 = local_68;
  std::function<bool_()>::function
            ((function<bool_()> *)(puVar1 + 1),(function<bool_()> *)auStack_60);
  pcStack_70 = std::
               _Function_handler<n_e_s::core::StepResult_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:691:29)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<n_e_s::core::StepResult_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:691:29)>
             ::_M_manager;
  local_88._M_unused._M_object = puVar1;
  Pipeline::push_conditional(__return_storage_ptr__,(ConditionalStepT *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)auStack_60);
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<n_e_s::core::StepResult_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:699:29)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<n_e_s::core::StepResult_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:699:29)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  Pipeline::push_conditional(__return_storage_ptr__,(ConditionalStepT *)&local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  local_68 = (undefined1  [8])0x0;
  auStack_60._0_8_ = (void *)0x0;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:712:17)>
             ::_M_invoke;
  auStack_60._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:712:17)>
       ::_M_manager;
  Pipeline::push(__return_storage_ptr__,(StepT *)local_68);
  std::_Function_base::~_Function_base((_Function_base *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_branch_instruction(
        const std::function<bool()> &condition) {
    Pipeline result;

    result.push_conditional([this, condition] {
        if (!condition()) {
            ++registers_->pc;
            return StepResult::Stop;
        }
        return StepResult::Continue;
    });

    result.push_conditional([this] {
        const uint8_t offset = mmu_->read_byte(registers_->pc++);
        const uint16_t page = high_byte(registers_->pc);

        registers_->pc += to_signed(offset);

        if (page != high_byte(registers_->pc)) {
            // We crossed a page boundary so we spend 1 more cycle.
            return StepResult::Continue;
        }
        return StepResult::Stop;
    });

    result.push([] { /* Do nothing. */ });

    return result;
}